

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

RAMBlock *
qemu_ram_alloc_from_ptr_mipsel(uc_struct_conflict5 *uc,ram_addr_t size,void *host,MemoryRegion *mr)

{
  MemoryListener *local_40;
  ram_addr_t max_size;
  RAMBlock *new_block;
  MemoryRegion *mr_local;
  void *host_local;
  ram_addr_t size_local;
  uc_struct_conflict5 *uc_local;
  
  local_40 = (MemoryListener *)size;
  host_local = (void *)size;
  if (host == (void *)0x0) {
    host_local = (void *)((size + uc->qemu_host_page_size) - 1 & -uc->qemu_host_page_size);
    local_40 = (MemoryListener *)((size + uc->qemu_host_page_size) - 1 & -uc->qemu_host_page_size);
  }
  uc_local = (uc_struct_conflict5 *)g_malloc0(0x48);
  if (uc_local == (uc_struct_conflict5 *)0x0) {
    uc_local = (uc_struct_conflict5 *)0x0;
  }
  else {
    *(MemoryRegion **)uc_local = mr;
    (uc_local->address_space_memory).current_map = (FlatView *)host_local;
    (uc_local->address_space_memory).listeners.tqh_first = local_40;
    if (local_40 < host_local) {
      __assert_fail("max_size >= size",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                    ,0x461,
                    "RAMBlock *qemu_ram_alloc_from_ptr_mipsel(struct uc_struct *, ram_addr_t, void *, MemoryRegion *)"
                   );
    }
    (uc_local->address_space_memory).uc = (uc_struct_conflict12 *)uc->qemu_real_host_page_size;
    *(void **)&uc_local->errnum = host;
    if (host != (void *)0x0) {
      *(uint32_t *)((long)&(uc_local->address_space_memory).listeners + 8) =
           *(uint32_t *)((long)&(uc_local->address_space_memory).listeners + 8) | 1;
    }
    uc->invalid_addr = 0;
    ram_block_add((uc_struct_conflict5 *)mr->uc,(RAMBlock *)uc_local);
    if (uc->invalid_error != 0) {
      g_free(uc_local);
      uc_local = (uc_struct_conflict5 *)0x0;
    }
  }
  return (RAMBlock *)uc_local;
}

Assistant:

RAMBlock *qemu_ram_alloc_from_ptr(struct uc_struct *uc, ram_addr_t size, void *host,
                                   MemoryRegion *mr)
{
    RAMBlock *new_block;
    ram_addr_t max_size = size;

    // Don't resize pre-alloced memory as they are given by users.
    if (!host) {
        size = HOST_PAGE_ALIGN(uc, size);
        max_size = HOST_PAGE_ALIGN(uc, max_size);
    }

    new_block = g_malloc0(sizeof(*new_block));
    if (new_block == NULL)
        return NULL;
    new_block->mr = mr;
    new_block->used_length = size;
    new_block->max_length = max_size;
    assert(max_size >= size);
    new_block->page_size = uc->qemu_real_host_page_size;
    new_block->host = host;
    if (host) {
        new_block->flags |= RAM_PREALLOC;
    }

    uc->invalid_addr = UC_ERR_OK;
    ram_block_add(mr->uc, new_block);

    if (uc->invalid_error != UC_ERR_OK) {
        g_free(new_block);
        return NULL;
    }

    return new_block;
}